

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O2

void test_given_mode<std::vector<unsigned_int,std::allocator<unsigned_int>>,true,gnuplotio::Mode1D>
               (ostream *log_fh,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header,
               undefined8 arg)

{
  ostream *poVar1;
  string fn_prefix;
  string modename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [32];
  
  gnuplotio::Mode1D::class_name_abi_cxx11_();
  std::operator+(&local_d8,&basedir_abi_cxx11_,"/");
  std::operator+(&bStack_118,&local_d8,header);
  std::operator+(&local_f8,&bStack_118,"-");
  std::operator+(&local_b8,&local_f8,&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&bStack_118);
  std::__cxx11::string::~string((string *)&local_d8);
  poVar1 = std::operator<<(log_fh,"* ");
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  poVar1 = std::operator<<(poVar1," -> ");
  std::operator+(&local_58,&local_b8,".bin");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_118,"record",(allocator<char> *)&local_d8);
  gnuplotio::Gnuplot::
  binaryFile<std::vector<unsigned_int,std::allocator<unsigned_int>>,gnuplotio::Mode1D>
            (&local_f8,&gp,arg,&local_58,&bStack_118);
  poVar1 = std::operator<<(poVar1,(string *)&local_f8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&bStack_118);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+(&local_78,&local_b8,".txt");
  gnuplotio::Gnuplot::file<std::vector<unsigned_int,std::allocator<unsigned_int>>,gnuplotio::Mode1D>
            (local_38,&gp,arg,&local_78);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void test_given_mode(
    std::ostream &log_fh, std::string header, const T &arg, ArrayMode
) {
    if constexpr (DoBinary) {
        std::string modename = ArrayMode::class_name();
        std::string fn_prefix = basedir+"/"+header+"-"+modename;
        log_fh << "* " << modename << " -> "
            << gp.binaryFile(arg, fn_prefix+".bin", "record", ArrayMode()) << std::endl;
        gp.file(arg, fn_prefix+".txt", ArrayMode());
    } else {
        std::string modename = ArrayMode::class_name();
        std::string fn_prefix = basedir+"/"+header+"-"+modename;
        log_fh << "* " << modename << " (skipped binary) " << std::endl;
        gp.file(arg, fn_prefix+".txt", ArrayMode());
    }
}